

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

string * __thiscall
DDSInfo::PrintDDSFlagNames_abi_cxx11_(string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 1) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(int *)(puVar1 + 4) != 0) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(int *)(puVar1 + 4) == 0) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 2)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 2) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 2) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 2) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 3)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 4) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 4) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 4) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 5)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 8) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 8) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 8) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 9)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  uVar3 = (uint)this;
  if ((uVar3 >> 0xc & 1) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1000) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1000) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 0x1001)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x20000) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x20000) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 0x20001)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x13 & 1) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x80000) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x80000) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 0x80001)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    puVar2 = &DAT_001433b8;
    if (_DAT_001433c0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001433b8;
      puVar1 = _DAT_001433c0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x800000) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x800000) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001433b8;
    if ((puVar2 != &DAT_001433b8) && (puVar1 = &DAT_001433b8, *(uint *)(puVar2 + 4) < 0x800001)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  RemoveTrailingCharacter(__return_storage_ptr__,'|');
  return __return_storage_ptr__;
}

Assistant:

std::string PrintDDSFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,dds_flag_names)
    #include "defs/dds/dds_flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }